

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cones.h
# Opt level: O0

bool __thiscall
mp::
Convert1QC<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::DoRun(Convert1QC<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
        *this,LinTerms *lint,int sens,double rhs)

{
  bool bVar1;
  size_t sVar2;
  int in_EDX;
  double in_RSI;
  MCKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *in_RDI;
  double in_XMM0_Qa;
  double dVar3;
  double dVar4;
  Convert1QC<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *unaff_retaddr;
  ConeArgs *in_stack_00000070;
  ConeArgs *in_stack_00000078;
  int in_stack_00000080;
  int in_stack_00000084;
  LinTerms *in_stack_00000088;
  ConeArgs rhs_args_1;
  ConeArgs lhs_args;
  ConeArgs rhs_args;
  int iY;
  int iX;
  undefined7 in_stack_fffffffffffffe08;
  undefined1 in_stack_fffffffffffffe0f;
  LinTerms *in_stack_fffffffffffffe10;
  int in_stack_fffffffffffffe44;
  Convert1QC<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *in_stack_fffffffffffffe48;
  double in_stack_fffffffffffffe58;
  undefined2 in_stack_fffffffffffffe60;
  undefined1 in_stack_fffffffffffffe62;
  undefined1 in_stack_fffffffffffffe63;
  undefined4 in_stack_fffffffffffffe64;
  byte local_168;
  int in_stack_ffffffffffffff34;
  Convert1QC<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *in_stack_ffffffffffffff38;
  byte local_90;
  undefined4 in_stack_ffffffffffffffe0;
  MCKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *pMVar5;
  int vX;
  undefined7 in_stack_fffffffffffffff8;
  byte in_stack_ffffffffffffffff;
  
  pMVar5 = in_RDI;
  sVar2 = LinTerms::size((LinTerms *)0x668c61);
  vX = (int)((ulong)pMVar5 >> 0x20);
  if (((sVar2 != 2) || (ABS(in_XMM0_Qa) != 0.0)) || (NAN(ABS(in_XMM0_Qa)))) {
LAB_00668f71:
    sVar2 = LinTerms::size((LinTerms *)0x668f7e);
    if (((sVar2 == 1) && (in_XMM0_Qa * (double)in_EDX <= 0.0)) &&
       (dVar3 = LinTerms::coef(in_stack_fffffffffffffe10,
                               CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08)),
       dVar3 * (double)in_EDX <= 0.0)) {
      LinTerms::var(in_stack_fffffffffffffe10,
                    CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08));
      CheckNorm2(in_stack_fffffffffffffe48,in_stack_fffffffffffffe44);
      bVar1 = mp::Convert1QC::ConeArgs::operator_cast_to_bool((ConeArgs *)0x669014);
      if ((bVar1) && ((local_168 & 1) == 0)) {
        MCKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
        ::MC(in_RDI);
        FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
        ::MakeFixedVar((FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                        *)CONCAT44(in_stack_fffffffffffffe64,
                                   CONCAT13(in_stack_fffffffffffffe63,
                                            CONCAT12(in_stack_fffffffffffffe62,
                                                     in_stack_fffffffffffffe60))),
                       in_stack_fffffffffffffe58);
        pre::NodeRange::operator_cast_to_int((NodeRange *)0x66909c);
        in_stack_fffffffffffffe10 =
             (LinTerms *)
             LinTerms::coef(in_stack_fffffffffffffe10,
                            CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08));
        in_stack_ffffffffffffffff =
             ContinueStdSOC(unaff_retaddr,
                            (double)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),vX
                            ,in_RSI,(ConeArgs *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0));
        bVar1 = true;
      }
      else {
        bVar1 = false;
      }
      ConeArgs::~ConeArgs((ConeArgs *)in_stack_fffffffffffffe10);
      if (bVar1) goto LAB_00669155;
    }
  }
  else {
    dVar3 = LinTerms::coef(in_stack_fffffffffffffe10,
                           CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08));
    dVar4 = LinTerms::coef(in_stack_fffffffffffffe10,
                           CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08));
    if (0.0 <= dVar3 * dVar4) goto LAB_00668f71;
    LinTerms::coef(in_stack_fffffffffffffe10,
                   CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08));
    LinTerms::var(in_stack_fffffffffffffe10,
                  CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08));
    CheckNorm2(in_stack_fffffffffffffe48,in_stack_fffffffffffffe44);
    bVar1 = mp::Convert1QC::ConeArgs::operator_cast_to_bool((ConeArgs *)0x668d6b);
    if (bVar1) {
      LinTerms::var(in_stack_fffffffffffffe10,
                    CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08));
      CheckSqrtXnXmNonneg(in_stack_ffffffffffffff38,in_stack_ffffffffffffff34);
      bVar1 = mp::Convert1QC::ConeArgs::operator_cast_to_bool((ConeArgs *)0x668dbe);
      if (bVar1) {
        in_stack_ffffffffffffffff =
             ContinueRotatedSOC((Convert1QC<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                                 *)rhs_args_1._0_8_,in_stack_00000088,in_stack_00000084,
                                in_stack_00000080,in_stack_00000078,in_stack_00000070);
      }
      ConeArgs::~ConeArgs((ConeArgs *)in_stack_fffffffffffffe10);
      if (!bVar1) {
        if ((local_90 & 1) != 0) goto LAB_00668f30;
        LinTerms::coef(in_stack_fffffffffffffe10,
                       CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08));
        LinTerms::var(in_stack_fffffffffffffe10,
                      CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08));
        LinTerms::coef(in_stack_fffffffffffffe10,
                       CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08));
        in_stack_ffffffffffffffff =
             ContinueStdSOC(unaff_retaddr,
                            (double)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),vX
                            ,in_RSI,(ConeArgs *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0));
        bVar1 = true;
      }
    }
    else {
LAB_00668f30:
      bVar1 = false;
    }
    ConeArgs::~ConeArgs((ConeArgs *)in_stack_fffffffffffffe10);
    if (bVar1 != false) goto LAB_00669155;
  }
  in_stack_ffffffffffffffff = 0;
LAB_00669155:
  return (bool)(in_stack_ffffffffffffffff & 1);
}

Assistant:

bool DoRun(const LinTerms& lint,
             int sens, double rhs) {
    assert((sens==1 || sens==-1) && "sens 1 or -1 only");
    if (2 == lint.size() &&                  // x>=y
        0.0 == std::fabs(rhs) &&             // rhs=0
        0.0 > lint.coef(0)*lint.coef(1)) {   // different signs
      // For sens>0 we have x>=y and iX=(index of pos coef)
      int iX = (lint.coef(1)>0.0);
      if (sens<0)
        iX = 1-iX;
      int iY = 1-iX;
      // Check if var(iY) := || vector-or-var ||
      if (auto rhs_args = CheckNorm2(lint.var(iY))) {
        if (auto lhs_args = CheckSqrtXnXmNonneg(lint.var(iX)))
          return ContinueRotatedSOC(lint, iX, iY,
                                    lhs_args, rhs_args);
        if (!rhs_args.is_from_abs_)          // not x >= abs(...)
          return ContinueStdSOC(lint.coef(iX), lint.var(iX),
                                lint.coef(iY), rhs_args);
      }
    } else if (1 == lint.size() &&           // const>=y.
               0.0 >= rhs*sens &&            // either ... <= rhs
               // or ... >= rhs(<0)
               0.0 >= lint.coef(0)*sens) {   // In the other case,
      // it's -k*sqrt(...) <= rhs(>0), k>0,
      // which is always true TODO
      if (auto rhs_args = CheckNorm2(lint.var(0))) {
        if (!rhs_args.is_from_abs_)          // not const >= abs(...)
          return ContinueStdSOC(std::fabs(rhs),
                                int( MC().MakeFixedVar( 1.0 ) ),
                                lint.coef(0), rhs_args);
      }
    }
    return false;
  }